

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

void borg_init_flow_kill(void)

{
  char **ppcVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  uint *puVar5;
  monster_race *pmVar6;
  monster_race *pmVar7;
  long lVar8;
  wchar_t wVar9;
  long lVar10;
  ushort uVar11;
  wchar_t wVar12;
  ulong uVar13;
  int16_t what [1024];
  char *text [1024];
  short local_2838 [1024];
  undefined8 local_2038 [1025];
  
  borg_kills_cnt = 0;
  borg_kills_nxt = 1;
  borg_kills = (borg_kill *)mem_zalloc(0x1d800);
  borg_race_count = (int16_t *)mem_zalloc((ulong)((uint)z_info->r_max * 2));
  borg_race_death = (int16_t *)mem_zalloc((ulong)((uint)z_info->r_max * 2));
  uVar11 = z_info->r_max;
  if (2 < uVar11) {
    lVar8 = 1;
    lVar10 = 0x160;
    pmVar7 = r_info;
    do {
      pmVar6 = pmVar7;
      if (((*(long *)((long)pmVar7 + lVar10 + -0x80) != 0) &&
          (_Var2 = flag_has_dbg((bitflag *)((long)pmVar7 + lVar10 + -0x34),0xb,1,"r_ptr->flags",
                                "RF_UNIQUE"), pmVar6 = r_info, !_Var2)) &&
         (pmVar7->flags[lVar10 + -0x5c] == '\0')) {
        borg_race_death[lVar8] = 1;
      }
      lVar8 = lVar8 + 1;
      uVar11 = z_info->r_max;
      lVar10 = lVar10 + 0xd0;
      pmVar7 = pmVar6;
    } while (lVar8 < (long)((ulong)uVar11 - 1));
  }
  uVar11 = uVar11 - 1;
  wVar9 = L'\0';
  if (1 < uVar11) {
    wVar9 = L'\0';
    uVar13 = 1;
    lVar8 = 300;
    do {
      pmVar7 = r_info;
      if ((*(long *)((long)r_info + lVar8 + -0x4c) != 0) &&
         (_Var2 = flag_has_dbg(r_info->flags + lVar8 + -0x5c,0xb,1,"r_ptr->flags","RF_UNIQUE"),
         _Var2)) {
        pcVar4 = borg_massage_special_chars(*(char **)((long)pmVar7 + lVar8 + -0x4c));
        local_2038[wVar9] = pcVar4;
        local_2838[wVar9] = (short)uVar13;
        pcVar4 = *(char **)((long)pmVar7 + lVar8 + -0x4c);
        iVar3 = strcmp(pcVar4,"Morgoth, Lord of Darkness");
        if (iVar3 == 0) {
          borg_morgoth_id = *(uint *)((long)pmVar7 + lVar8 + -0x54);
        }
        iVar3 = strcmp(pcVar4,"Sauron, the Sorcerer");
        if (iVar3 == 0) {
          borg_sauron_id = *(uint *)((long)pmVar7 + lVar8 + -0x54);
        }
        iVar3 = strcmp(pcVar4,"The Tarrasque");
        if (iVar3 == 0) {
          borg_tarrasque_id = *(uint *)((long)pmVar7 + lVar8 + -0x54);
        }
        wVar9 = wVar9 + L'\x01';
      }
      uVar13 = uVar13 + 1;
      lVar8 = lVar8 + 0xd0;
    } while (uVar11 != uVar13);
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(local_2038,local_2838,wVar9);
  borg_unique_size = wVar9;
  borg_unique_text = (char **)mem_zalloc((long)wVar9 * 8);
  puVar5 = (uint *)mem_zalloc((long)borg_unique_size << 2);
  ppcVar1 = borg_unique_text;
  borg_unique_what = puVar5;
  if (L'\0' < wVar9) {
    uVar13 = 0;
    do {
      ppcVar1[uVar13] = (char *)local_2038[uVar13];
      uVar13 = uVar13 + 1;
    } while ((uint)wVar9 != uVar13);
    uVar13 = 0;
    do {
      puVar5[uVar13] = (int)local_2838[uVar13];
      uVar13 = uVar13 + 1;
    } while ((uint)wVar9 != uVar13);
  }
  wVar9 = L'\0';
  if (1 < uVar11) {
    wVar9 = L'\0';
    uVar13 = 1;
    lVar8 = 300;
    do {
      pmVar7 = r_info;
      wVar12 = wVar9;
      if ((*(long *)((long)r_info + lVar8 + -0x4c) != 0) &&
         (_Var2 = flag_has_dbg(r_info->flags + lVar8 + -0x5c,0xb,1,"r_ptr->flags","RF_UNIQUE"),
         !_Var2)) {
        pcVar4 = borg_massage_special_chars(*(char **)((long)pmVar7 + lVar8 + -0x4c));
        local_2038[wVar9] = pcVar4;
        local_2838[wVar9] = (short)uVar13;
        wVar12 = wVar9 + L'\x01';
        pcVar4 = *(char **)((long)pmVar7 + lVar8 + -0x3c);
        if (pcVar4 != (char *)0x0) {
          pcVar4 = borg_massage_special_chars(pcVar4);
          local_2038[wVar12] = pcVar4;
          local_2838[wVar12] = (short)uVar13;
          wVar12 = wVar9 + L'\x02';
        }
      }
      wVar9 = wVar12;
      uVar13 = uVar13 + 1;
      lVar8 = lVar8 + 0xd0;
    } while (uVar11 != uVar13);
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(local_2038,local_2838,wVar9);
  borg_normal_size = wVar9;
  borg_normal_text = (char **)mem_zalloc((long)wVar9 * 8);
  puVar5 = (uint *)mem_zalloc((long)borg_normal_size << 2);
  ppcVar1 = borg_normal_text;
  borg_normal_what = puVar5;
  if (L'\0' < wVar9) {
    uVar13 = 0;
    do {
      ppcVar1[uVar13] = (char *)local_2038[uVar13];
      uVar13 = uVar13 + 1;
    } while ((uint)wVar9 != uVar13);
    uVar13 = 0;
    do {
      puVar5[uVar13] = (int)local_2838[uVar13];
      uVar13 = uVar13 + 1;
    } while ((uint)wVar9 != uVar13);
  }
  return;
}

Assistant:

void borg_init_flow_kill(void)
{
    /*** Monster tracking ***/

    /* No monsters yet */
    borg_kills_cnt = 0;
    borg_kills_nxt = 1;

    /* Array of monsters */
    borg_kills = mem_zalloc(256 * sizeof(borg_kill));

    /* Count racial appearances */
    borg_race_count = mem_zalloc(z_info->r_max * sizeof(int16_t));

    /* Count racial deaths */
    borg_race_death = mem_zalloc(z_info->r_max * sizeof(int16_t));

    /*** XXX XXX XXX Hack -- Cheat ***/

    /* Hack -- Extract dead uniques */
    for (int i = 1; i < z_info->r_max - 1; i++) {
        struct monster_race *r_ptr = &r_info[i];

        /* Skip non-monsters */
        if (!r_ptr->name)
            continue;

        /* Skip non-uniques */
        if (rf_has(r_ptr->flags, RF_UNIQUE))
            continue;

        /* Mega-Hack -- Access "dead unique" list */
        if (r_ptr->max_num == 0)
            borg_race_death[i] = 1;
    }

    borg_init_monster_names();
}